

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void drftb1(int n,float *c,float *ch,float *wa,int *ifac)

{
  int iVar1;
  int ip_00;
  int ido_00;
  int iVar2;
  int idl1;
  int ido;
  int ix3;
  int ix2;
  int iw;
  int ip;
  int nf;
  int na;
  int l2;
  int l1;
  int k1;
  int i;
  int *ifac_local;
  float *wa_local;
  float *ch_local;
  float *c_local;
  int n_local;
  
  iVar1 = ifac[1];
  ip = 0;
  na = 1;
  ix3 = 1;
  for (l2 = 0; l2 < iVar1; l2 = l2 + 1) {
    ip_00 = ifac[l2 + 2];
    ido_00 = n / (ip_00 * na);
    if (ip_00 == 4) {
      iVar2 = ix3 + ido_00;
      if (ip == 0) {
        dradb4(ido_00,na,c,ch,wa + (long)ix3 + -1,wa + (long)iVar2 + -1,
               wa + (long)(iVar2 + ido_00) + -1);
      }
      else {
        dradb4(ido_00,na,ch,c,wa + (long)ix3 + -1,wa + (long)iVar2 + -1,
               wa + (long)(iVar2 + ido_00) + -1);
      }
      ip = 1 - ip;
    }
    else if (ip_00 == 2) {
      if (ip == 0) {
        dradb2(ido_00,na,c,ch,wa + (long)ix3 + -1);
      }
      else {
        dradb2(ido_00,na,ch,c,wa + (long)ix3 + -1);
      }
      ip = 1 - ip;
    }
    else if (ip_00 == 3) {
      if (ip == 0) {
        dradb3(ido_00,na,c,ch,wa + (long)ix3 + -1,wa + (long)(ix3 + ido_00) + -1);
      }
      else {
        dradb3(ido_00,na,ch,c,wa + (long)ix3 + -1,wa + (long)(ix3 + ido_00) + -1);
      }
      ip = 1 - ip;
    }
    else {
      if (ip == 0) {
        dradbg(ido_00,ip_00,na,ido_00 * na,c,c,c,ch,ch,wa + (long)ix3 + -1);
      }
      else {
        dradbg(ido_00,ip_00,na,ido_00 * na,ch,ch,ch,c,c,wa + (long)ix3 + -1);
      }
      if (ido_00 == 1) {
        ip = 1 - ip;
      }
    }
    ix3 = (ip_00 + -1) * ido_00 + ix3;
    na = ip_00 * na;
  }
  if (ip != 0) {
    for (l1 = 0; l1 < n; l1 = l1 + 1) {
      c[l1] = ch[l1];
    }
  }
  return;
}

Assistant:

static void drftb1(int n, float *c, float *ch, float *wa, int *ifac){
  int i,k1,l1,l2;
  int na;
  int nf,ip,iw,ix2,ix3,ido,idl1;

  nf=ifac[1];
  na=0;
  l1=1;
  iw=1;

  for(k1=0;k1<nf;k1++){
    ip=ifac[k1 + 2];
    l2=ip*l1;
    ido=n/l2;
    idl1=ido*l1;
    if(ip!=4)goto L103;
    ix2=iw+ido;
    ix3=ix2+ido;

    if(na!=0)
      dradb4(ido,l1,ch,c,wa+iw-1,wa+ix2-1,wa+ix3-1);
    else
      dradb4(ido,l1,c,ch,wa+iw-1,wa+ix2-1,wa+ix3-1);
    na=1-na;
    goto L115;

  L103:
    if(ip!=2)goto L106;

    if(na!=0)
      dradb2(ido,l1,ch,c,wa+iw-1);
    else
      dradb2(ido,l1,c,ch,wa+iw-1);
    na=1-na;
    goto L115;

  L106:
    if(ip!=3)goto L109;

    ix2=iw+ido;
    if(na!=0)
      dradb3(ido,l1,ch,c,wa+iw-1,wa+ix2-1);
    else
      dradb3(ido,l1,c,ch,wa+iw-1,wa+ix2-1);
    na=1-na;
    goto L115;

  L109:
/*    The radix five case can be translated later..... */
/*    if(ip!=5)goto L112;

    ix2=iw+ido;
    ix3=ix2+ido;
    ix4=ix3+ido;
    if(na!=0)
      dradb5(ido,l1,ch,c,wa+iw-1,wa+ix2-1,wa+ix3-1,wa+ix4-1);
    else
      dradb5(ido,l1,c,ch,wa+iw-1,wa+ix2-1,wa+ix3-1,wa+ix4-1);
    na=1-na;
    goto L115;

  L112:*/
    if(na!=0)
      dradbg(ido,ip,l1,idl1,ch,ch,ch,c,c,wa+iw-1);
    else
      dradbg(ido,ip,l1,idl1,c,c,c,ch,ch,wa+iw-1);
    if(ido==1)na=1-na;

  L115:
    l1=l2;
    iw+=(ip-1)*ido;
  }

  if(na==0)return;

  for(i=0;i<n;i++)c[i]=ch[i];
}